

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_photogrammetry.cpp
# Opt level: O0

bool __thiscall
ON_AerialPhotoCameraPosition::SetOrientationAnglesRadians
          (ON_AerialPhotoCameraPosition *this,double omega_radians,double phi_radians,
          double kappa_radians)

{
  ON_3dVector axis;
  ON_3dVector axis_00;
  ON_3dVector axis_01;
  ON_3dPoint center;
  ON_3dPoint center_00;
  ON_3dPoint center_01;
  bool bVar1;
  double *pdVar2;
  double dVar3;
  double d;
  double d_00;
  double xx;
  double d_01;
  double d_02;
  ON_3dVector local_828;
  ON_3dVector local_810;
  ON_3dVector local_7f8;
  int local_7e0;
  int local_7dc;
  int j;
  int i;
  double max_zero;
  double b;
  double a;
  ON_Xform zero;
  undefined1 local_6c0 [8];
  ON_Xform r321;
  undefined1 local_610 [8];
  ON_Xform r3;
  undefined1 local_510 [8];
  ON_3dVector r2r1z0;
  undefined1 local_4c8 [8];
  ON_Xform r2;
  ON_3dVector r1y0;
  undefined1 local_400 [8];
  ON_Xform r1;
  ON_3dVector local_368;
  undefined1 local_350 [8];
  ON_3dVector y3;
  ON_3dVector local_320;
  undefined1 local_308 [8];
  ON_3dVector x3;
  ON_3dVector z3;
  ON_3dVector local_2c0;
  undefined1 local_2a8 [8];
  ON_3dVector x2;
  ON_3dVector local_278;
  undefined1 local_260 [8];
  ON_3dVector z2;
  ON_3dVector y2;
  ON_3dVector local_218;
  undefined1 local_200 [8];
  ON_3dVector z1;
  ON_3dVector local_1d0;
  undefined1 local_1b8 [8];
  ON_3dVector y1;
  ON_3dVector x1;
  ON_3dVector z0;
  ON_3dVector y0;
  ON_3dVector x0;
  double local_138;
  double local_130;
  undefined1 local_128 [8];
  ON_Xform R;
  ON_3dVector Z;
  ON_3dVector Y;
  ON_3dVector X;
  double s3;
  double c3;
  double s2;
  double c2;
  double s1;
  double c1;
  bool rc;
  double kappa_radians_local;
  double phi_radians_local;
  double omega_radians_local;
  ON_AerialPhotoCameraPosition *this_local;
  
  c1._7_1_ = false;
  bVar1 = ON_IsValid(omega_radians);
  if (((bVar1) && (bVar1 = ON_IsValid(phi_radians), bVar1)) &&
     (bVar1 = ON_IsValid(kappa_radians), bVar1)) {
    ON_3dVector::Set(&this->m_orientation_angles_radians,omega_radians,phi_radians,kappa_radians);
    ON_3dVector::Set(&this->m_orientation_angles_degrees,(omega_radians * 180.0) / 3.141592653589793
                     ,(phi_radians * 180.0) / 3.141592653589793,
                     (kappa_radians * 180.0) / 3.141592653589793);
    dVar3 = cos(omega_radians);
    d = sin(omega_radians);
    d_00 = cos(phi_radians);
    xx = sin(phi_radians);
    d_01 = cos(kappa_radians);
    d_02 = sin(kappa_radians);
    ON_3dVector::ON_3dVector
              ((ON_3dVector *)&Y.z,d_01 * d_00,d_02 * dVar3 + d_01 * xx * d,
               d_02 * d + -(d_01 * xx * dVar3));
    ON_3dVector::ON_3dVector
              ((ON_3dVector *)&Z.z,-d_02 * d_00,d_01 * dVar3 + -(d_02 * xx * d),
               d_01 * d + d_02 * xx * dVar3);
    ON_3dVector::ON_3dVector((ON_3dVector *)(R.m_xform[3] + 3),xx,-d_00 * d,d_00 * dVar3);
    ON_Xform::ON_Xform((ON_Xform *)local_128);
    local_128 = (undefined1  [8])Y.z;
    R.m_xform[0][0] = Z.z;
    R.m_xform[0][1] = R.m_xform[3][3];
    R.m_xform[0][2] = 0.0;
    R.m_xform[1][0] = Y.x;
    R.m_xform[1][1] = Z.x;
    R.m_xform[1][2] = 0.0;
    R.m_xform[2][0] = Y.y;
    R.m_xform[2][1] = Z.y;
    R.m_xform[2][2] = 0.0;
    R.m_xform[2][3] = 0.0;
    R.m_xform[3][0] = 0.0;
    R.m_xform[3][1] = 0.0;
    R.m_xform[3][2] = 1.0;
    memcpy(&this->m_orientation_rotation,local_128,0x80);
    (this->m_orientation_right).x = Y.z;
    (this->m_orientation_right).y = X.x;
    (this->m_orientation_right).z = X.y;
    (this->m_orientation_up).x = Z.z;
    (this->m_orientation_up).y = Y.x;
    (this->m_orientation_up).z = Y.y;
    ON_3dVector::operator-((ON_3dVector *)&x0.z,(ON_3dVector *)(R.m_xform[3] + 3));
    (this->m_orientation_direction).x = x0.z;
    (this->m_orientation_direction).y = local_138;
    (this->m_orientation_direction).z = local_130;
    this->m_status = this->m_status | 2;
    c1._7_1_ = true;
    ON_3dVector::ON_3dVector((ON_3dVector *)&y0.z,1.0,0.0,0.0);
    ON_3dVector::ON_3dVector((ON_3dVector *)&z0.z,0.0,1.0,0.0);
    ON_3dVector::ON_3dVector((ON_3dVector *)&x1.z,0.0,0.0,1.0);
    y1.z = y0.z;
    x1.x = x0.x;
    x1.y = x0.y;
    ::operator*(&local_1d0,dVar3,(ON_3dVector *)&z0.z);
    ::operator*((ON_3dVector *)&z1.z,d,(ON_3dVector *)&x1.z);
    ON_3dVector::operator+((ON_3dVector *)local_1b8,&local_1d0,(ON_3dVector *)&z1.z);
    ::operator*(&local_218,-d,(ON_3dVector *)&z0.z);
    ::operator*((ON_3dVector *)&y2.z,dVar3,(ON_3dVector *)&x1.z);
    ON_3dVector::operator+((ON_3dVector *)local_200,&local_218,(ON_3dVector *)&y2.z);
    z2.z = (double)local_1b8;
    y2.x = y1.x;
    y2.y = y1.y;
    ::operator*(&local_278,xx,(ON_3dVector *)&y1.z);
    ::operator*((ON_3dVector *)&x2.z,d_00,(ON_3dVector *)local_200);
    ON_3dVector::operator+((ON_3dVector *)local_260,&local_278,(ON_3dVector *)&x2.z);
    ::operator*(&local_2c0,d_00,(ON_3dVector *)&y1.z);
    ::operator*((ON_3dVector *)&z3.z,xx,(ON_3dVector *)local_200);
    ON_3dVector::operator-((ON_3dVector *)local_2a8,&local_2c0,(ON_3dVector *)&z3.z);
    x3.z = (double)local_260;
    z3.x = z2.x;
    z3.y = z2.y;
    ::operator*(&local_320,d_01,(ON_3dVector *)local_2a8);
    ::operator*((ON_3dVector *)&y3.z,d_02,(ON_3dVector *)&z2.z);
    ON_3dVector::operator+((ON_3dVector *)local_308,&local_320,(ON_3dVector *)&y3.z);
    ::operator*(&local_368,-d_02,(ON_3dVector *)local_2a8);
    ::operator*((ON_3dVector *)(r1.m_xform[3] + 3),d_01,(ON_3dVector *)&z2.z);
    ON_3dVector::operator+((ON_3dVector *)local_350,&local_368,(ON_3dVector *)(r1.m_xform[3] + 3));
    ON_Xform::ON_Xform((ON_Xform *)local_400);
    axis.y = x0.x;
    axis.x = y0.z;
    axis.z = x0.y;
    center.y = ON_3dPoint::Origin.y;
    center.x = ON_3dPoint::Origin.x;
    center.z = ON_3dPoint::Origin.z;
    ON_Xform::Rotation((ON_Xform *)local_400,omega_radians,axis,center);
    ON_Xform::operator*((ON_3dVector *)(r2.m_xform[3] + 3),(ON_Xform *)local_400,
                        (ON_3dVector *)&z0.z);
    ON_Xform::ON_Xform((ON_Xform *)local_4c8);
    r2r1z0.z = ON_3dPoint::Origin.x;
    axis_00.y = r1y0.x;
    axis_00.x = r2.m_xform[3][3];
    axis_00.z = r1y0.y;
    center_00.y = ON_3dPoint::Origin.y;
    center_00.x = ON_3dPoint::Origin.x;
    center_00.z = ON_3dPoint::Origin.z;
    ON_Xform::Rotation((ON_Xform *)local_4c8,phi_radians,axis_00,center_00);
    ON_Xform::operator*((ON_Xform *)(r3.m_xform[3] + 3),(ON_Xform *)local_4c8,(ON_Xform *)local_400)
    ;
    ON_Xform::operator*((ON_3dVector *)local_510,(ON_Xform *)(r3.m_xform[3] + 3),
                        (ON_3dVector *)&x1.z);
    ON_Xform::ON_Xform((ON_Xform *)local_610);
    r321.m_xform[3][3] = ON_3dPoint::Origin.x;
    axis_01.y = r2r1z0.x;
    axis_01.x = (double)local_510;
    axis_01.z = r2r1z0.y;
    center_01.y = ON_3dPoint::Origin.y;
    center_01.x = ON_3dPoint::Origin.x;
    center_01.z = ON_3dPoint::Origin.z;
    ON_Xform::Rotation((ON_Xform *)local_610,kappa_radians,axis_01,center_01);
    ON_Xform::operator*((ON_Xform *)(zero.m_xform[3] + 3),(ON_Xform *)local_610,
                        (ON_Xform *)local_4c8);
    ON_Xform::operator*((ON_Xform *)local_6c0,(ON_Xform *)(zero.m_xform[3] + 3),
                        (ON_Xform *)local_400);
    ON_Xform::operator-((ON_Xform *)&a,(ON_Xform *)local_6c0,(ON_Xform *)local_128);
    _j = 0.0;
    for (local_7dc = 0; local_7dc < 4; local_7dc = local_7dc + 1) {
      for (local_7e0 = 0; local_7e0 < 4; local_7e0 = local_7e0 + 1) {
        pdVar2 = ON_Xform::operator[]((ON_Xform *)&a,local_7dc);
        b = (double)((ulong)pdVar2[local_7e0] & (ulong)DAT_009d3010);
        if (_j < b) {
          _j = b;
        }
      }
    }
    ON_3dVector::operator-(&local_7f8,(ON_3dVector *)local_308,(ON_3dVector *)&Y.z);
    dVar3 = ON_3dVector::MaximumCoordinate(&local_7f8);
    max_zero = ABS(dVar3);
    if (_j < max_zero) {
      _j = max_zero;
    }
    ON_3dVector::operator-(&local_810,(ON_3dVector *)local_350,(ON_3dVector *)&Z.z);
    dVar3 = ON_3dVector::MaximumCoordinate(&local_810);
    max_zero = ABS(dVar3);
    if (_j < max_zero) {
      _j = max_zero;
    }
    ON_3dVector::operator-(&local_828,(ON_3dVector *)&x3.z,(ON_3dVector *)(R.m_xform[3] + 3));
    dVar3 = ON_3dVector::MaximumCoordinate(&local_828);
    max_zero = ABS(dVar3);
    if (_j < max_zero) {
      _j = max_zero;
    }
    if (1e-15 < _j) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_photogrammetry.cpp"
                 ,0x2d9,"","Transform trauma");
    }
  }
  else {
    UnsetOrientation(this);
  }
  return c1._7_1_;
}

Assistant:

bool ON_AerialPhotoCameraPosition::SetOrientationAnglesRadians(
    double omega_radians, 
    double phi_radians, 
    double kappa_radians
    )
{
  bool rc = false;

  if ( ON_IsValid(omega_radians) && ON_IsValid(phi_radians) && ON_IsValid(kappa_radians) )
  {
    m_orientation_angles_radians.Set(omega_radians,phi_radians,kappa_radians);
    m_orientation_angles_degrees.Set(omega_radians*180.0/ON_PI,phi_radians*180.0/ON_PI,kappa_radians*180.0/ON_PI);

    const double c1 = cos(omega_radians);
    const double s1 = sin(omega_radians);
  
    const double c2 = cos(phi_radians);
    const double s2 = sin(phi_radians);
  
    const double c3 = cos(kappa_radians);
    const double s3 = sin(kappa_radians);

    const ON_3dVector X( c3*c2,  s3*c1 + c3*s2*s1,  s3*s1 - c3*s2*c1);
    const ON_3dVector Y(-s3*c2,  c3*c1 - s3*s2*s1,  c3*s1 + s3*s2*c1);
    const ON_3dVector Z(    s2,            -c2*s1,             c2*c1);

    ON_Xform R;
    R.m_xform[0][0] = X.x; R.m_xform[0][1] = Y.x; R.m_xform[0][2] = Z.x; R.m_xform[0][3] = 0.0;
    R.m_xform[1][0] = X.y; R.m_xform[1][1] = Y.y; R.m_xform[1][2] = Z.y; R.m_xform[1][3] = 0.0;
    R.m_xform[2][0] = X.z; R.m_xform[2][1] = Y.z; R.m_xform[2][2] = Z.z; R.m_xform[2][3] = 0.0;
    R.m_xform[3][0] = 0.0; R.m_xform[3][1] = 0.0; R.m_xform[3][2] = 0.0; R.m_xform[3][3] = 1.0;

    m_orientation_rotation = R;

    m_orientation_right = X;
    m_orientation_up = Y;
    m_orientation_direction = -Z;

    m_status |= 2;

    rc = true;

    {
      // Debugging validation tests

      const ON_3dVector x0(1.0,0.0,0.0);
      const ON_3dVector y0(0.0,1.0,0.0);
      const ON_3dVector z0(0.0,0.0,1.0);

      const ON_3dVector x1 = x0;
      const ON_3dVector y1 =  c1*y0 + s1*z0;
      const ON_3dVector z1 = -s1*y0 + c1*z0;

      const ON_3dVector y2 = y1;
      const ON_3dVector z2 = s2*x1 + c2*z1;
      const ON_3dVector x2 = c2*x1 - s2*z1;

      const ON_3dVector z3 =  z2;
      const ON_3dVector x3 =  c3*x2 + s3*y2;
      const ON_3dVector y3 = -s3*x2 + c3*y2;

      /*
      const ON_3dVector x1 = x0;
      const ON_3dVector y1 = (0.0,  c1,  s1);
      const ON_3dVector z1 = (0.0, -s1,  c1);

      const ON_3dVector x2 = (c2,  s2*s1, -s2*c1); // c2*x1 - s2*z1;
      const ON_3dVector y2 = (0.0,    c1,     s1);
      const ON_3dVector z2 = (s2, -c2*s1,  c2*c1); // s2*x1 + c2*z1
      */


      ON_Xform r1;
      r1.Rotation(omega_radians,x0,ON_3dPoint::Origin);
      ON_3dVector r1y0 = r1*y0;

      ON_Xform r2;
      r2.Rotation(phi_radians,r1y0,ON_3dPoint::Origin);
      ON_3dVector r2r1z0 = r2*r1*z0;

      ON_Xform r3;
      r3.Rotation(kappa_radians,r2r1z0,ON_3dPoint::Origin);

      ON_Xform r321 = r3*r2*r1;


      ON_Xform zero = r321 - R;

      double a, b;
      double max_zero = 0.0;
      for ( int i = 0; i < 4; i++ ) for ( int j = 0; j < 4; j++ )
      {
        a = fabs(zero[i][j]);
        if (a > max_zero )
          max_zero = a;
      }
      b = fabs((x3-X).MaximumCoordinate());
      if ( b > max_zero )
        max_zero = b;
      b = fabs((y3-Y).MaximumCoordinate());
      if ( b > max_zero )
        max_zero = b;
      b = fabs((z3-Z).MaximumCoordinate());
      if ( b > max_zero )
        max_zero = b;


      if ( max_zero > 1.0e-15 )
        ON_ERROR("Transform trauma");
    }
  }
  else
  {
    UnsetOrientation();
  }

  return rc;
}